

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  char buffer [12];
  
  builtin_strncpy(buffer,"Hello Mraa!",0xc);
  signal(2,sig_handler);
  mraa_init();
  lVar1 = mraa_uart_init(0);
  if (lVar1 == 0) {
    fwrite("Failed to initialize UART\n",0x1a,1,_stderr);
    mraa_deinit();
    iVar2 = 1;
  }
  else {
    while (flag != 0) {
      mraa_uart_write(lVar1,buffer,0xc);
      sleep(1);
    }
    mraa_uart_stop(lVar1);
    iVar2 = 0;
    mraa_deinit();
  }
  return iVar2;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_uart_context uart;
    char buffer[] = "Hello Mraa!";

    /* install signal handler */
    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize UART */
    uart = mraa_uart_init(UART);
    if (uart == NULL) {
        fprintf(stderr, "Failed to initialize UART\n");
        goto err_exit;
    }

    while (flag) {
        /* send data through UART */
        mraa_uart_write(uart, buffer, sizeof(buffer));

        sleep(1);
    }

    /* stop UART */
    mraa_uart_stop(uart);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}